

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QPalette __thiscall QApplicationPrivate::basePalette(QApplicationPrivate *this)

{
  QPlatformTheme *pQVar1;
  QPalette *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  QPalette QVar3;
  QPalette *themePalette;
  QPalette *palette;
  QPalette *in_stack_ffffffffffffffa8;
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->currentGroup = &DAT_aaaaaaaaaaaaaaaa;
  if (app_style == (QStyle *)0x0) {
    QPalette::QPalette(in_RDI,gray);
  }
  else {
    (**(code **)(*(long *)app_style + 0xa8))(in_RDI);
  }
  pQVar1 = QGuiApplicationPrivate::platformTheme();
  if (pQVar1 == (QPlatformTheme *)0x0) {
    this_00 = (QPalette *)0x0;
  }
  else {
    pQVar1 = QGuiApplicationPrivate::platformTheme();
    this_00 = (QPalette *)(**(code **)(*(long *)pQVar1 + 0x50))(pQVar1,0);
  }
  if (this_00 != (QPalette *)0x0) {
    QPalette::resolve((QPalette *)&local_18);
    QPalette::operator=(this_00,in_stack_ffffffffffffffa8);
    QPalette::~QPalette(&local_18);
  }
  QPalette::setResolveMask((ulonglong)in_RDI);
  uVar2 = extraout_RDX;
  if (app_style != (QStyle *)0x0) {
    (**(code **)(*(long *)app_style + 0x80))(app_style,in_RDI);
    uVar2 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar3._8_8_ = uVar2;
  QVar3.d = (QPalettePrivate *)in_RDI;
  return QVar3;
}

Assistant:

QPalette QApplicationPrivate::basePalette() const
{
    // Start out with a palette based on the style, in case there's no theme
    // available, or so that we can fill in missing roles in the theme.
    QPalette palette = app_style ? app_style->standardPalette() : Qt::gray;

    // Prefer theme palette if available, but fill in missing roles from style
    // for compatibility. Note that the style's standard palette is not prioritized
    // over the theme palette, as the documented way of applying the style's palette
    // is to set it explicitly using QApplication::setPalette().
    if (const QPalette *themePalette = platformTheme() ? platformTheme()->palette() : nullptr)
        palette = themePalette->resolve(palette);

    // This palette now is Qt-generated, so reset the resolve mask. This allows
    // QStyle::polish implementations to respect palettes that are user provided,
    // by checking if the palette has a brush set for a color that the style might
    // otherwise overwrite.
    palette.setResolveMask(0);

    // Finish off by letting the application style polish the palette. This will
    // not result in the polished palette becoming a user-set palette, as the
    // resulting base palette is only used as a fallback, with the resolve mask
    // set to 0.
    if (app_style)
        app_style->polish(palette);

    return palette;
}